

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O3

CURLcode calc_payload_hash(Curl_easy *data,uchar *sha_hash,char *sha_hex)

{
  uchar *input;
  CURLcode CVar1;
  size_t length;
  
  input = (uchar *)(data->set).postfields;
  if (input == (uchar *)0x0) {
    length = 0;
  }
  else {
    length = (data->set).postfieldsize;
    if ((long)length < 0) {
      length = strlen((char *)input);
    }
  }
  CVar1 = Curl_sha256it(sha_hash,input,length);
  if (CVar1 == CURLE_OK) {
    Curl_hexencode(sha_hash,0x20,(uchar *)sha_hex,0x41);
  }
  return CVar1;
}

Assistant:

static CURLcode calc_payload_hash(struct Curl_easy *data,
                                  unsigned char *sha_hash, char *sha_hex)
{
  const char *post_data = data->set.postfields;
  size_t post_data_len = 0;
  CURLcode result;

  if(post_data) {
    if(data->set.postfieldsize < 0)
      post_data_len = strlen(post_data);
    else
      post_data_len = (size_t)data->set.postfieldsize;
  }
  result = Curl_sha256it(sha_hash, (const unsigned char *) post_data,
                         post_data_len);
  if(!result)
    sha256_to_hex(sha_hex, sha_hash);
  return result;
}